

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MinTypMaxExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MinTypMaxExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ExpressionSyntax *args_2,
          Token *args_3,ExpressionSyntax *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  MinTypMaxExpressionSyntax *pMVar11;
  
  pMVar11 = (MinTypMaxExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MinTypMaxExpressionSyntax *)this->endPtr < pMVar11 + 1) {
    pMVar11 = (MinTypMaxExpressionSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pMVar11 + 1);
  }
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar7 = args_3->kind;
  uVar8 = args_3->field_0x2;
  NVar9.raw = (args_3->numFlags).raw;
  uVar10 = args_3->rawLen;
  pIVar2 = args_3->info;
  (pMVar11->super_ExpressionSyntax).super_SyntaxNode.kind = MinTypMaxExpression;
  (pMVar11->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar11->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pMVar11->min).ptr = args;
  (pMVar11->colon1).kind = TVar3;
  (pMVar11->colon1).field_0x2 = uVar4;
  (pMVar11->colon1).numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar11->colon1).rawLen = uVar6;
  (pMVar11->colon1).info = pIVar1;
  (pMVar11->typ).ptr = args_2;
  (pMVar11->colon2).kind = TVar7;
  (pMVar11->colon2).field_0x2 = uVar8;
  (pMVar11->colon2).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar11->colon2).rawLen = uVar10;
  (pMVar11->colon2).info = pIVar2;
  (pMVar11->max).ptr = args_4;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pMVar11;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pMVar11;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pMVar11;
  return pMVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }